

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_engine_base.cpp
# Opt level: O3

void __thiscall
zmq::stream_engine_base_t::stream_engine_base_t
          (stream_engine_base_t *this,fd_t fd_,options_t *options_,
          endpoint_uri_pair_t *endpoint_uri_pair_,bool has_handshake_stage_)

{
  string *ip_addr_;
  pointer pcVar1;
  int iVar2;
  ostream *poVar3;
  int *piVar4;
  char *errmsg_;
  EVP_PKEY_CTX *ctx;
  ucred cred;
  socklen_t size;
  ostringstream buf;
  int local_1e4 [3];
  options_t *local_1d8;
  socklen_t local_1cc;
  long *local_1c8;
  long local_1b8 [2];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  io_object_t::io_object_t(&this->super_io_object_t,(io_thread_t *)0x0);
  (this->super_io_object_t).super_i_poll_events._vptr_i_poll_events =
       (_func_int **)&PTR__stream_engine_base_t_002666e8;
  (this->super_i_engine)._vptr_i_engine = (_func_int **)&PTR__stream_engine_base_t_002667a8;
  options_t::options_t(&this->_options,options_);
  *(undefined8 *)&this->field_0x560 = 0;
  this->_metadata = (metadata_t *)0x0;
  *(undefined8 *)&this->field_0x550 = 0;
  this->_process_msg = 0;
  this->_mechanism = (mechanism_t *)0x0;
  this->_next_msg = 0;
  this->_outsize = 0;
  this->_encoder = (i_encoder *)0x0;
  this->_decoder = (i_decoder *)0x0;
  this->_outpos = (uchar *)0x0;
  this->_inpos = (uchar *)0x0;
  this->_insize = 0;
  this->_input_stopped = false;
  this->_output_stopped = false;
  (this->_endpoint_uri_pair).local._M_dataplus._M_p =
       (pointer)&(this->_endpoint_uri_pair).local.field_2;
  pcVar1 = (endpoint_uri_pair_->local)._M_dataplus._M_p;
  local_1d8 = &this->_options;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_endpoint_uri_pair,pcVar1,
             pcVar1 + (endpoint_uri_pair_->local)._M_string_length);
  (this->_endpoint_uri_pair).remote._M_dataplus._M_p =
       (pointer)&(this->_endpoint_uri_pair).remote.field_2;
  pcVar1 = (endpoint_uri_pair_->remote)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->_endpoint_uri_pair).remote,pcVar1,
             pcVar1 + (endpoint_uri_pair_->remote)._M_string_length);
  (this->_endpoint_uri_pair).local_type = endpoint_uri_pair_->local_type;
  ip_addr_ = &this->_peer_address;
  this->_has_handshake_timer = false;
  this->_has_ttl_timer = false;
  this->_has_timeout_timer = false;
  this->_has_heartbeat_timer = false;
  (this->_peer_address)._M_dataplus._M_p = (pointer)&(this->_peer_address).field_2;
  (this->_peer_address)._M_string_length = 0;
  (this->_peer_address).field_2._M_local_buf[0] = '\0';
  ctx = (EVP_PKEY_CTX *)ip_addr_;
  iVar2 = get_peer_ip_address(fd_,ip_addr_);
  if (iVar2 == 1) {
    local_1cc = 0xc;
    ctx = (EVP_PKEY_CTX *)0x1;
    iVar2 = getsockopt(fd_,1,0x11,local_1e4,&local_1cc);
    if (iVar2 == 0) {
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
      std::ostream::operator<<(poVar3,local_1e4[0]);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_append((char *)ip_addr_,(ulong)local_1c8);
      if (local_1c8 != local_1b8) {
        operator_delete(local_1c8,local_1b8[0] + 1);
      }
      ctx = (EVP_PKEY_CTX *)&std::__cxx11::ostringstream::VTT;
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
    }
  }
  else if (iVar2 == 0) {
    (this->_peer_address)._M_string_length = 0;
    *(this->_peer_address)._M_dataplus._M_p = '\0';
  }
  this->_s = fd_;
  this->_handle = (handle_t)0x0;
  this->_plugged = false;
  this->_handshaking = true;
  this->_io_error = false;
  this->_session = (session_base_t *)0x0;
  this->_socket = (socket_base_t *)0x0;
  this->_has_handshake_stage = has_handshake_stage_;
  iVar2 = msg_t::init(&this->_tx_msg,ctx);
  if (iVar2 != 0) {
    piVar4 = __errno_location();
    errmsg_ = strerror(*piVar4);
    fprintf(_stderr,"%s (%s:%d)\n",errmsg_,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/stream_engine_base.cpp"
            ,0x88);
    fflush(_stderr);
    zmq_abort(errmsg_);
  }
  unblock_socket(this->_s);
  return;
}

Assistant:

zmq::stream_engine_base_t::stream_engine_base_t (
  fd_t fd_,
  const options_t &options_,
  const endpoint_uri_pair_t &endpoint_uri_pair_,
  bool has_handshake_stage_) :
    _options (options_),
    _inpos (NULL),
    _insize (0),
    _decoder (NULL),
    _outpos (NULL),
    _outsize (0),
    _encoder (NULL),
    _mechanism (NULL),
    _next_msg (NULL),
    _process_msg (NULL),
    _metadata (NULL),
    _input_stopped (false),
    _output_stopped (false),
    _endpoint_uri_pair (endpoint_uri_pair_),
    _has_handshake_timer (false),
    _has_ttl_timer (false),
    _has_timeout_timer (false),
    _has_heartbeat_timer (false),
    _peer_address (get_peer_address (fd_)),
    _s (fd_),
    _handle (static_cast<handle_t> (NULL)),
    _plugged (false),
    _handshaking (true),
    _io_error (false),
    _session (NULL),
    _socket (NULL),
    _has_handshake_stage (has_handshake_stage_)
{
    const int rc = _tx_msg.init ();
    errno_assert (rc == 0);

    //  Put the socket into non-blocking mode.
    unblock_socket (_s);
}